

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Bra.c
# Opt level: O0

Byte * z7_BranchConv_ARM64_Enc(Byte *data,SizeT size,UInt32 pc)

{
  int iVar1;
  uint uVar2;
  uint *puVar3;
  UInt32 pc_local;
  SizeT size_local;
  Byte *data_local;
  UInt32 c_1;
  UInt32 z;
  UInt32 c;
  UInt32 v;
  UInt32 mask;
  UInt32 flag;
  Byte *lim;
  uint *local_10;
  
  iVar1 = (pc - (int)data) + -4;
  puVar3 = (uint *)data;
  while (local_10 = puVar3, local_10 != (uint *)(data + (size & 0xfffffffffffffffc))) {
    uVar2 = *local_10;
    puVar3 = local_10 + 1;
    if ((uVar2 + 0x6c000000 & 0xfc000000) == 0) {
      z = ((uint)(iVar1 + (int)puVar3) >> 2) + uVar2;
      *local_10 = z & 0x3ffffff | 0x94000000;
    }
    else if (((uVar2 + 0x70000000 & 0x9f000000) == 0) &&
            (uVar2 = uVar2 + 0x70100000, (uVar2 & 0xe00000) == 0)) {
      data_local._4_4_ =
           ((uint)(iVar1 + (int)puVar3) >> 9 & 0xfffffff8) + (uVar2 & 0xffffffe0 | uVar2 >> 0x1a);
      *local_10 = (data_local._4_4_ & 0x1fffff) - 0x100000 & 0xffffe0 |
                  data_local._4_4_ * 0x4000000 | uVar2 & 0x1f | 0x90000000;
    }
  }
  return (Byte *)local_10;
}

Assistant:

Z7_BRANCH_FUNCS_IMP(BranchConv_ARM64)


Z7_BRANCH_FUNC_MAIN(BranchConv_ARM)
{
  // Byte *p = data;
  const Byte *lim;
  size &= ~(SizeT)3;
  lim = p + size;
  BR_PC_INIT
  /* in ARM: branch offset is relative to the +2 instructions from current instruction.
     (p) will point to next instruction */
  pc += 8 - 4;
  
  for (;;)
  {
    for (;;)
    {
      if Z7_UNLIKELY(p >= lim) { return p; }  p += 4;  if Z7_UNLIKELY(p[-1] == 0xeb) break;
      if Z7_UNLIKELY(p >= lim) { return p; }  p += 4;  if Z7_UNLIKELY(p[-1] == 0xeb) break;
    }
    {
      UInt32 v = GetUi32a(p - 4);
      UInt32 c = BR_PC_GET >> 2;
      BR_CONVERT_VAL(v, c)
      v &= 0x00ffffff;
      v |= 0xeb000000;
      SetUi32a(p - 4, v)
    }
  }
}